

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O1

RPCHelpMan * wallet::listdescriptors(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string name_00;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_13;
  RPCArgOptions opts;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  undefined8 uVar9;
  RPCHelpMan *in_RDI;
  long lVar10;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  undefined4 in_stack_ffffffffffffef18;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffef1c;
  undefined1 in_stack_ffffffffffffef20 [16];
  undefined8 in_stack_ffffffffffffef38;
  undefined8 in_stack_ffffffffffffef40;
  undefined8 in_stack_ffffffffffffef48;
  code *pcVar12;
  undefined8 in_stack_ffffffffffffef50;
  undefined1 in_stack_ffffffffffffef58 [16];
  pointer in_stack_ffffffffffffef68;
  pointer pRVar13;
  pointer in_stack_ffffffffffffef70;
  pointer in_stack_ffffffffffffef78;
  pointer pRVar14;
  pointer in_stack_ffffffffffffef80;
  pointer in_stack_ffffffffffffef88;
  pointer pRVar15;
  pointer in_stack_ffffffffffffef90;
  pointer pRVar16;
  pointer in_stack_ffffffffffffef98;
  pointer pRVar17;
  undefined8 in_stack_ffffffffffffefa0;
  pointer in_stack_ffffffffffffefa8;
  pointer in_stack_ffffffffffffefb0;
  pointer in_stack_ffffffffffffefb8;
  undefined8 in_stack_ffffffffffffefc0;
  pointer in_stack_ffffffffffffefc8;
  pointer pRVar18;
  pointer in_stack_ffffffffffffefd8;
  _Vector_impl_data in_stack_ffffffffffffefe0;
  pointer in_stack_ffffffffffffeff8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_fe8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_fc8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_fa8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_f88;
  vector<RPCResult,_std::allocator<RPCResult>_> local_f70;
  vector<RPCResult,_std::allocator<RPCResult>_> local_f58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_f38;
  RPCResults local_f20;
  allocator_type local_f02;
  bool local_f01;
  vector<RPCArg,_std::allocator<RPCArg>_> local_f00;
  string local_ee8;
  string local_ec8;
  string local_ea8;
  string local_e88;
  string local_e68;
  string local_e48;
  string local_e28;
  string local_e08;
  string local_de8;
  string local_dc8;
  string local_da8;
  string local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  ulong *local_d28;
  undefined8 local_d20;
  ulong local_d18;
  undefined8 uStack_d10;
  ulong *local_d08;
  size_type local_d00;
  ulong local_cf8;
  undefined8 uStack_cf0;
  long *local_ce8 [2];
  long local_cd8 [2];
  long *local_cc8 [2];
  long local_cb8 [2];
  long *local_ca8 [2];
  long local_c98 [2];
  long *local_c88 [2];
  long local_c78 [2];
  long *local_c68 [2];
  long local_c58 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_c48;
  long *local_c28 [2];
  long local_c18 [2];
  pointer local_c08 [2];
  undefined1 local_bf8 [152];
  RPCResult local_b60;
  long *local_ad8 [2];
  long local_ac8 [2];
  long *local_ab8 [2];
  long local_aa8 [2];
  long *local_a98 [2];
  long local_a88 [2];
  long *local_a78 [2];
  long local_a68 [2];
  long *local_a58 [2];
  long local_a48 [2];
  long *local_a38 [2];
  long local_a28 [2];
  long *local_a18 [2];
  long local_a08 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_9f8;
  long *local_9d8 [2];
  long local_9c8 [2];
  pointer local_9b8 [2];
  undefined1 local_9a8 [152];
  RPCResult local_910;
  RPCResult local_888;
  RPCResult local_800;
  RPCResult local_778;
  RPCResult local_6f0;
  RPCResult local_668;
  long *local_5e0 [2];
  long local_5d0 [2];
  long *local_5c0 [2];
  long local_5b0 [2];
  RPCResult local_5a0;
  long *local_518 [2];
  long local_508 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_4f8;
  long *local_4d8 [2];
  long local_4c8 [2];
  pointer local_4b8 [2];
  undefined1 local_4a8 [152];
  RPCResult local_410;
  long *local_388 [2];
  long local_378 [2];
  long *local_368 [2];
  long local_358 [2];
  RPCResult local_348;
  undefined1 local_2c0;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  undefined1 local_298 [32];
  long *local_278 [2];
  long local_268 [2];
  UniValue local_258;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  pRVar18 = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"listdescriptors","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nList descriptors imported into a descriptor-enabled wallet.\n",""
            );
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"private","");
  local_f01 = false;
  UniValue::UniValue<bool,_bool,_true>(&local_258,&local_f01);
  paVar1 = &local_258.val.field_2;
  local_200._8_8_ = (long)&local_200 + 0x18;
  local_200._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_258.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.val._M_dataplus._M_p == paVar1) {
    local_200._32_8_ = local_258.val.field_2._8_8_;
  }
  else {
    local_200._8_8_ = local_258.val._M_dataplus._M_p;
  }
  local_200._16_8_ = local_258.val._M_string_length;
  local_258.val._M_string_length = 0;
  local_258.val.field_2._M_local_buf[0] = '\0';
  local_200._40_8_ =
       local_258.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_200._48_8_ =
       local_258.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_200._56_8_ =
       local_258.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_258.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200._64_4_ =
       local_258.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_200._68_4_ =
       local_258.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_200._72_4_ =
       local_258.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_200._76_4_ =
       local_258.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_200._80_8_ =
       local_258.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_258.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8 = 2;
  local_278[0] = local_268;
  local_258.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,"Show private descriptors.","");
  local_2b8 = &local_2a8;
  local_2c0 = 0;
  local_2b0 = 0;
  local_2a8 = 0;
  local_298._0_8_ = (pointer)0x0;
  local_298._8_2_ = 0;
  local_298._10_6_ = 0;
  local_298._16_2_ = 0;
  local_298._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef1c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef18;
  name._8_16_ = in_stack_ffffffffffffef20;
  name.field_2._8_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffef40;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffef38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffef48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffef50;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffef58;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffef68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffef70;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffef78;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffef80;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffef88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffef90;
  description_13._M_string_length = in_stack_ffffffffffffefa0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef98;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffefa8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffefb0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffefc0;
  opts._0_8_ = in_stack_ffffffffffffefb8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffefc8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)pRVar18;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffefd8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffefe0;
  opts._64_8_ = in_stack_ffffffffffffeff8;
  ::RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_13,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_f00,__l,&local_f02);
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"");
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"");
  local_4b8[0] = (pointer)local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"wallet_name","");
  local_4d8[0] = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4d8,"Name of wallet this operation was performed on","");
  local_f58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef1c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef18;
  m_key_name._8_16_ = in_stack_ffffffffffffef20;
  m_key_name.field_2._8_8_ = in_RDI;
  description._M_string_length = in_stack_ffffffffffffef40;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffef68;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_4a8 + 0x10),STR,m_key_name,description,inner,SUB81(local_4b8,0));
  local_4f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_4f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"descriptors","");
  local_518[0] = local_508;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_518,
             "Array of descriptor objects (sorted by descriptor string representation)","");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"");
  local_9b8[0] = (pointer)local_9a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9b8,"desc","");
  local_9d8[0] = local_9c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9d8,"Descriptor string representation","");
  local_fa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_fa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_fa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef1c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef18;
  m_key_name_00._8_16_ = in_stack_ffffffffffffef20;
  m_key_name_00.field_2._8_8_ = in_RDI;
  description_00._M_string_length = in_stack_ffffffffffffef40;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_00.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef68;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_9a8 + 0x10),STR,m_key_name_00,description_00,inner_00,
             SUB81(local_9b8,0));
  local_9f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_9f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f8,"timestamp","");
  local_a18[0] = local_a08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a18,"The creation time of the descriptor","");
  local_fc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_fc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_fc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef1c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef18;
  m_key_name_01._8_16_ = in_stack_ffffffffffffef20;
  m_key_name_01.field_2._8_8_ = in_RDI;
  description_01._M_string_length = in_stack_ffffffffffffef40;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_01.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef68;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult(&local_910,NUM,m_key_name_01,description_01,inner_01,SUB81(&local_9f8,0));
  local_a38[0] = local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"active","");
  local_a58[0] = local_a48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a58,
             "Whether this descriptor is currently used to generate new addresses","");
  local_fe8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_fe8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_fe8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef1c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef18;
  m_key_name_02._8_16_ = in_stack_ffffffffffffef20;
  m_key_name_02.field_2._8_8_ = in_RDI;
  description_02._M_string_length = in_stack_ffffffffffffef40;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_02.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef68;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult(&local_888,BOOL,m_key_name_02,description_02,inner_02,SUB81(local_a38,0));
  local_a78[0] = local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"internal","");
  local_a98[0] = local_a88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a98,
             "True if this descriptor is used to generate change addresses. False if this descriptor is used to generate receiving addresses; defined only for active descriptors"
             ,"");
  uVar11 = 0;
  auVar4._4_16_ = in_stack_ffffffffffffef20;
  auVar4._0_4_ = in_stack_ffffffffffffef1c;
  auVar4._20_8_ = in_RDI;
  auVar4._28_4_ = 0;
  description_03._M_string_length = in_stack_ffffffffffffef40;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_03.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef68;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult
            (&local_800,BOOL,(string)(auVar4 << 0x20),SUB81(local_a78,0),description_03,inner_03,
             true);
  local_ab8[0] = local_aa8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ab8,"range","");
  local_ad8[0] = local_ac8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ad8,"Defined only for ranged descriptors","");
  local_c08[0] = (pointer)local_bf8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c08,"");
  local_c28[0] = local_c18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c28,"Range start inclusive","");
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef1c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name_03._8_16_ = in_stack_ffffffffffffef20;
  m_key_name_03.field_2._8_8_ = in_RDI;
  description_04._M_string_length = in_stack_ffffffffffffef40;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_04.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef68;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_bf8 + 0x10),NUM,m_key_name_03,description_04,inner_04,
             SUB81(local_c08,0));
  local_c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c48,"");
  local_c68[0] = local_c58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c68,"Range end inclusive","");
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef1c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name_04._8_16_ = in_stack_ffffffffffffef20;
  m_key_name_04.field_2._8_8_ = in_RDI;
  description_05._M_string_length = in_stack_ffffffffffffef40;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_05.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef68;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult(&local_b60,NUM,m_key_name_04,description_05,inner_05,SUB81(&local_c48,0));
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)(local_bf8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffefe0,__l_00,
             (allocator_type *)&stack0xffffffffffffefa7);
  auVar5._4_16_ = in_stack_ffffffffffffef20;
  auVar5._0_4_ = in_stack_ffffffffffffef1c;
  auVar5._20_8_ = in_RDI;
  auVar5._28_4_ = 0;
  description_06._M_string_length = in_stack_ffffffffffffef40;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_06.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef68;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult
            (&local_778,ARR_FIXED,(string)(auVar5 << 0x20),SUB81(local_ab8,0),description_06,
             inner_06,true);
  local_c88[0] = local_c78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"next","");
  local_ca8[0] = local_c98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ca8,"Same as next_index field. Kept for compatibility reason.","");
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  auVar6._4_16_ = in_stack_ffffffffffffef20;
  auVar6._0_4_ = in_stack_ffffffffffffef1c;
  auVar6._20_8_ = in_RDI;
  auVar6._28_4_ = 0;
  description_07._M_string_length = in_stack_ffffffffffffef40;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_07.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffef68;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult
            (&local_6f0,NUM,(string)(auVar6 << 0x20),SUB81(local_c88,0),description_07,inner_07,true
            );
  local_cc8[0] = local_cb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cc8,"next_index","");
  local_ce8[0] = local_cd8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ce8,
             "The next index to generate addresses from; defined only for ranged descriptors","");
  pRVar13 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  uVar11 = 0;
  auVar7._4_16_ = in_stack_ffffffffffffef20;
  auVar7._0_4_ = in_stack_ffffffffffffef1c;
  auVar7._20_8_ = in_RDI;
  auVar7._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffef40;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_08.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult
            (&local_668,NUM,(string)(auVar7 << 0x20),SUB81(local_cc8,0),description_08,inner_08,true
            );
  __l_01._M_len = 7;
  __l_01._M_array = (iterator)(local_9a8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_f88,__l_01,(allocator_type *)&stack0xffffffffffffef67);
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef1c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name_05._8_16_ = in_stack_ffffffffffffef20;
  m_key_name_05.field_2._8_8_ = in_RDI;
  description_09._M_string_length = in_stack_ffffffffffffef40;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_09.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar13;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult(&local_5a0,OBJ,m_key_name_05,description_09,inner_09,SUB81(local_5c0,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_5a0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_f70,__l_02,(allocator_type *)&stack0xffffffffffffef66);
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef1c;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name_06._8_16_ = in_stack_ffffffffffffef20;
  m_key_name_06.field_2._8_8_ = in_RDI;
  description_10._M_string_length = in_stack_ffffffffffffef40;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_10.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar13;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult(&local_410,ARR,m_key_name_06,description_10,inner_10,SUB81(&local_4f8,0));
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)(local_4a8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_f38,__l_03,(allocator_type *)&stack0xffffffffffffef65);
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffef1c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name_07._8_16_ = in_stack_ffffffffffffef20;
  m_key_name_07.field_2._8_8_ = in_RDI;
  description_11._M_string_length = in_stack_ffffffffffffef40;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef38;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffef48;
  description_11.field_2._8_8_ = in_stack_ffffffffffffef50;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar13;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffef58._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffef58._8_8_;
  ::RPCResult::RPCResult(&local_348,OBJ,m_key_name_07,description_11,inner_11,SUB81(local_368,0));
  result._4_4_ = in_stack_ffffffffffffef1c;
  result.m_type = uVar11;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef20._0_8_;
  result.m_key_name._M_string_length = in_stack_ffffffffffffef20._8_8_;
  result.m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffef38;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef40;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef48;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef50;
  result.m_optional = (bool)in_stack_ffffffffffffef58[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffef58[1];
  result._66_6_ = in_stack_ffffffffffffef58._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef58._8_8_;
  result.m_description._M_string_length = (size_type)pRVar13;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar18;
  result.m_description.field_2._8_8_ = pRVar14;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffef80;
  result.m_cond._M_string_length = (size_type)pRVar15;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar16;
  result.m_cond.field_2._8_8_ = pRVar17;
  RPCResults::RPCResults(&local_f20,result);
  local_da8._M_dataplus._M_p = (pointer)&local_da8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_da8,"listdescriptors","");
  local_dc8._M_dataplus._M_p = (pointer)&local_dc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_dc8,"");
  HelpExampleCli(&local_d88,&local_da8,&local_dc8);
  local_e08._M_dataplus._M_p = (pointer)&local_e08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e08,"listdescriptors","");
  local_e28._M_dataplus._M_p = (pointer)&local_e28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e28,"");
  HelpExampleRpc(&local_de8,&local_e08,&local_e28);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d88._M_dataplus._M_p != &local_d88.field_2) {
    uVar9 = local_d88.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_de8._M_string_length + local_d88._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_de8._M_dataplus._M_p != &local_de8.field_2) {
      uVar9 = local_de8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_de8._M_string_length + local_d88._M_string_length) goto LAB_00288411;
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_de8,0,0,local_d88._M_dataplus._M_p,local_d88._M_string_length);
  }
  else {
LAB_00288411:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_d88,local_de8._M_dataplus._M_p,local_de8._M_string_length);
  }
  local_d68._M_dataplus._M_p = (pointer)&local_d68.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar8->_M_dataplus)._M_p;
  paVar1 = &pbVar8->field_2;
  if (paVar2 == paVar1) {
    local_d68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d68.field_2._8_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 8);
    local_d68.field_2._12_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 0xc);
  }
  else {
    local_d68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d68._M_dataplus._M_p = (pointer)paVar2;
  }
  local_d68._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar8->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_e68._M_dataplus._M_p = (pointer)&local_e68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e68,"listdescriptors","");
  local_e88._M_dataplus._M_p = (pointer)&local_e88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e88,"true","");
  HelpExampleCli(&local_e48,&local_e68,&local_e88);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
    uVar9 = local_d68.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_e48._M_string_length + local_d68._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e48._M_dataplus._M_p != &local_e48.field_2) {
      uVar9 = local_e48.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_e48._M_string_length + local_d68._M_string_length) goto LAB_0028854a;
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_e48,0,0,local_d68._M_dataplus._M_p,local_d68._M_string_length);
  }
  else {
LAB_0028854a:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_d68,local_e48._M_dataplus._M_p,local_e48._M_string_length);
  }
  local_d48._M_dataplus._M_p = (pointer)&local_d48.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar8->_M_dataplus)._M_p;
  paVar1 = &pbVar8->field_2;
  if (paVar2 == paVar1) {
    local_d48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d48.field_2._8_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 8);
    local_d48.field_2._12_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 0xc);
  }
  else {
    local_d48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d48._M_dataplus._M_p = (pointer)paVar2;
  }
  local_d48._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar8->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_ec8._M_dataplus._M_p = (pointer)&local_ec8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ec8,"listdescriptors","");
  local_ee8._M_dataplus._M_p = (pointer)&local_ee8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ee8,"true","");
  HelpExampleRpc(&local_ea8,&local_ec8,&local_ee8);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
    uVar9 = local_d48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_ea8._M_string_length + local_d48._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ea8._M_dataplus._M_p != &local_ea8.field_2) {
      uVar9 = local_ea8.field_2._M_allocated_capacity;
    }
    if (local_ea8._M_string_length + local_d48._M_string_length <= (ulong)uVar9) {
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_ea8,0,0,local_d48._M_dataplus._M_p,local_d48._M_string_length);
      goto LAB_002886ab;
    }
  }
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d48,local_ea8._M_dataplus._M_p,local_ea8._M_string_length);
LAB_002886ab:
  local_d28 = &local_d18;
  puVar3 = (ulong *)(pbVar8->_M_dataplus)._M_p;
  paVar1 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar1) {
    local_d18 = paVar1->_M_allocated_capacity;
    uStack_d10 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_d18 = paVar1->_M_allocated_capacity;
    local_d28 = puVar3;
  }
  local_d00 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar8->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_d28 == &local_d18) {
    uStack_cf0 = uStack_d10;
    local_d08 = &local_cf8;
  }
  else {
    local_d08 = local_d28;
  }
  local_cf8 = local_d18;
  local_d20 = 0;
  local_d18 = local_d18 & 0xffffffffffffff00;
  pcVar12 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp:1803:9)>
            ::_M_manager;
  name_00._8_16_ = in_stack_ffffffffffffef20;
  name_00._M_dataplus._M_p = &stack0xffffffffffffef38;
  name_00.field_2._8_8_ = in_RDI;
  description_12.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp:1803:9)>
       ::_M_manager;
  description_12._M_dataplus._M_p = (pointer)0x0;
  description_12._M_string_length = 0;
  description_12.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/backup.cpp:1803:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar13;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffef58._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffef58._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar14;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar18;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffef80;
  examples.m_examples._M_string_length = (size_type)pRVar16;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar15;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar17;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffefa0;
  local_d28 = &local_d18;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_00,description_12,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar12 != (code *)0x0) {
    (*pcVar12)(&stack0xffffffffffffef38,&stack0xffffffffffffef38,3);
  }
  if (local_d08 != &local_cf8) {
    operator_delete(local_d08,local_cf8 + 1);
  }
  if (local_d28 != &local_d18) {
    operator_delete(local_d28,local_d18 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ea8._M_dataplus._M_p != &local_ea8.field_2) {
    operator_delete(local_ea8._M_dataplus._M_p,local_ea8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ee8._M_dataplus._M_p != &local_ee8.field_2) {
    operator_delete(local_ee8._M_dataplus._M_p,local_ee8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ec8._M_dataplus._M_p != &local_ec8.field_2) {
    operator_delete(local_ec8._M_dataplus._M_p,local_ec8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
    operator_delete(local_d48._M_dataplus._M_p,local_d48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e48._M_dataplus._M_p != &local_e48.field_2) {
    operator_delete(local_e48._M_dataplus._M_p,local_e48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e88._M_dataplus._M_p != &local_e88.field_2) {
    operator_delete(local_e88._M_dataplus._M_p,local_e88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e68._M_dataplus._M_p != &local_e68.field_2) {
    operator_delete(local_e68._M_dataplus._M_p,local_e68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
    operator_delete(local_d68._M_dataplus._M_p,local_d68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_de8._M_dataplus._M_p != &local_de8.field_2) {
    operator_delete(local_de8._M_dataplus._M_p,local_de8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e28._M_dataplus._M_p != &local_e28.field_2) {
    operator_delete(local_e28._M_dataplus._M_p,local_e28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08._M_dataplus._M_p != &local_e08.field_2) {
    operator_delete(local_e08._M_dataplus._M_p,local_e08.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d88._M_dataplus._M_p != &local_d88.field_2) {
    operator_delete(local_d88._M_dataplus._M_p,local_d88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc8._M_dataplus._M_p != &local_dc8.field_2) {
    operator_delete(local_dc8._M_dataplus._M_p,local_dc8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da8._M_dataplus._M_p != &local_da8.field_2) {
    operator_delete(local_da8._M_dataplus._M_p,local_da8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f20.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_cond._M_dataplus._M_p != &local_348.m_cond.field_2) {
    operator_delete(local_348.m_cond._M_dataplus._M_p,
                    local_348.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_description._M_dataplus._M_p != &local_348.m_description.field_2) {
    operator_delete(local_348.m_description._M_dataplus._M_p,
                    local_348.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_348.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_key_name._M_dataplus._M_p != &local_348.m_key_name.field_2) {
    operator_delete(local_348.m_key_name._M_dataplus._M_p,
                    local_348.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f38);
  lVar10 = 0x110;
  do {
    if ((long *)(local_4a8 + lVar10) != *(long **)((long)local_4b8 + lVar10)) {
      operator_delete(*(long **)((long)local_4b8 + lVar10),*(long *)(local_4a8 + lVar10) + 1);
    }
    if ((long *)((long)local_4c8 + lVar10) != *(long **)((long)local_4d8 + lVar10)) {
      operator_delete(*(long **)((long)local_4d8 + lVar10),*(long *)((long)local_4c8 + lVar10) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_4f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar10));
    if ((long *)((long)local_508 + lVar10) != *(long **)((long)local_518 + lVar10)) {
      operator_delete(*(long **)((long)local_518 + lVar10),*(long *)((long)local_508 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0.m_cond._M_dataplus._M_p != &local_5a0.m_cond.field_2) {
    operator_delete(local_5a0.m_cond._M_dataplus._M_p,
                    local_5a0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0.m_description._M_dataplus._M_p != &local_5a0.m_description.field_2) {
    operator_delete(local_5a0.m_description._M_dataplus._M_p,
                    local_5a0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_5a0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0.m_key_name._M_dataplus._M_p != &local_5a0.m_key_name.field_2) {
    operator_delete(local_5a0.m_key_name._M_dataplus._M_p,
                    local_5a0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f88);
  lVar10 = 0x3b8;
  do {
    if ((long *)(local_9a8 + lVar10) != *(long **)((long)local_9b8 + lVar10)) {
      operator_delete(*(long **)((long)local_9b8 + lVar10),*(long *)(local_9a8 + lVar10) + 1);
    }
    if ((long *)((long)local_9c8 + lVar10) != *(long **)((long)local_9d8 + lVar10)) {
      operator_delete(*(long **)((long)local_9d8 + lVar10),*(long *)((long)local_9c8 + lVar10) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_9f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar10));
    if ((long *)((long)local_a08 + lVar10) != *(long **)((long)local_a18 + lVar10)) {
      operator_delete(*(long **)((long)local_a18 + lVar10),*(long *)((long)local_a08 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffef68);
  if (local_ce8[0] != local_cd8) {
    operator_delete(local_ce8[0],local_cd8[0] + 1);
  }
  if (local_cc8[0] != local_cb8) {
    operator_delete(local_cc8[0],local_cb8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffef88);
  if (local_ca8[0] != local_c98) {
    operator_delete(local_ca8[0],local_c98[0] + 1);
  }
  if (local_c88[0] != local_c78) {
    operator_delete(local_c88[0],local_c78[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffefe0);
  lVar10 = 0x110;
  do {
    if ((long *)(local_bf8 + lVar10) != *(long **)((long)local_c08 + lVar10)) {
      operator_delete(*(long **)((long)local_c08 + lVar10),*(long *)(local_bf8 + lVar10) + 1);
    }
    if ((long *)((long)local_c18 + lVar10) != *(long **)((long)local_c28 + lVar10)) {
      operator_delete(*(long **)((long)local_c28 + lVar10),*(long *)((long)local_c18 + lVar10) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar10));
    if ((long *)((long)local_c58 + lVar10) != *(long **)((long)local_c68 + lVar10)) {
      operator_delete(*(long **)((long)local_c68 + lVar10),*(long *)((long)local_c58 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffefa8);
  if (local_c68[0] != local_c58) {
    operator_delete(local_c68[0],local_c58[0] + 1);
  }
  if (local_c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_c48.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffefc8);
  if (local_c28[0] != local_c18) {
    operator_delete(local_c28[0],local_c18[0] + 1);
  }
  if (local_c08[0] != (pointer)local_bf8) {
    operator_delete(local_c08[0],local_bf8._0_8_ + 1);
  }
  if (local_ad8[0] != local_ac8) {
    operator_delete(local_ad8[0],local_ac8[0] + 1);
  }
  if (local_ab8[0] != local_aa8) {
    operator_delete(local_ab8[0],local_aa8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeff8);
  if (local_a98[0] != local_a88) {
    operator_delete(local_a98[0],local_a88[0] + 1);
  }
  if (local_a78[0] != local_a68) {
    operator_delete(local_a78[0],local_a68[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_fe8);
  if (local_a58[0] != local_a48) {
    operator_delete(local_a58[0],local_a48[0] + 1);
  }
  if (local_a38[0] != local_a28) {
    operator_delete(local_a38[0],local_a28[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_fc8);
  if (local_a18[0] != local_a08) {
    operator_delete(local_a18[0],local_a08[0] + 1);
  }
  if (local_9f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_9f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_9f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_9f8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_fa8);
  if (local_9d8[0] != local_9c8) {
    operator_delete(local_9d8[0],local_9c8[0] + 1);
  }
  if (local_9b8[0] != (pointer)local_9a8) {
    operator_delete(local_9b8[0],local_9a8._0_8_ + 1);
  }
  if (local_5e0[0] != local_5d0) {
    operator_delete(local_5e0[0],local_5d0[0] + 1);
  }
  if (local_5c0[0] != local_5b0) {
    operator_delete(local_5c0[0],local_5b0[0] + 1);
  }
  if (local_518[0] != local_508) {
    operator_delete(local_518[0],local_508[0] + 1);
  }
  if (local_4f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_4f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_4f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_4f8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_f58);
  if (local_4d8[0] != local_4c8) {
    operator_delete(local_4d8[0],local_4c8[0] + 1);
  }
  if (local_4b8[0] != (pointer)local_4a8) {
    operator_delete(local_4b8[0],local_4a8._0_8_ + 1);
  }
  if (local_388[0] != local_378) {
    operator_delete(local_388[0],local_378[0] + 1);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_f00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_298);
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,CONCAT71(uStack_2a7,local_2a8) + 1);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_258.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.val._M_dataplus._M_p != &local_258.val.field_2) {
    operator_delete(local_258.val._M_dataplus._M_p,
                    CONCAT71(local_258.val.field_2._M_allocated_capacity._1_7_,
                             local_258.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listdescriptors()
{
    return RPCHelpMan{
        "listdescriptors",
        "\nList descriptors imported into a descriptor-enabled wallet.\n",
        {
            {"private", RPCArg::Type::BOOL, RPCArg::Default{false}, "Show private descriptors."}
        },
        RPCResult{RPCResult::Type::OBJ, "", "", {
            {RPCResult::Type::STR, "wallet_name", "Name of wallet this operation was performed on"},
            {RPCResult::Type::ARR, "descriptors", "Array of descriptor objects (sorted by descriptor string representation)",
            {
                {RPCResult::Type::OBJ, "", "", {
                    {RPCResult::Type::STR, "desc", "Descriptor string representation"},
                    {RPCResult::Type::NUM, "timestamp", "The creation time of the descriptor"},
                    {RPCResult::Type::BOOL, "active", "Whether this descriptor is currently used to generate new addresses"},
                    {RPCResult::Type::BOOL, "internal", /*optional=*/true, "True if this descriptor is used to generate change addresses. False if this descriptor is used to generate receiving addresses; defined only for active descriptors"},
                    {RPCResult::Type::ARR_FIXED, "range", /*optional=*/true, "Defined only for ranged descriptors", {
                        {RPCResult::Type::NUM, "", "Range start inclusive"},
                        {RPCResult::Type::NUM, "", "Range end inclusive"},
                    }},
                    {RPCResult::Type::NUM, "next", /*optional=*/true, "Same as next_index field. Kept for compatibility reason."},
                    {RPCResult::Type::NUM, "next_index", /*optional=*/true, "The next index to generate addresses from; defined only for ranged descriptors"},
                }},
            }}
        }},
        RPCExamples{
            HelpExampleCli("listdescriptors", "") + HelpExampleRpc("listdescriptors", "")
            + HelpExampleCli("listdescriptors", "true") + HelpExampleRpc("listdescriptors", "true")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> wallet = GetWalletForJSONRPCRequest(request);
    if (!wallet) return UniValue::VNULL;

    if (!wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "listdescriptors is not available for non-descriptor wallets");
    }

    const bool priv = !request.params[0].isNull() && request.params[0].get_bool();
    if (priv) {
        EnsureWalletIsUnlocked(*wallet);
    }

    LOCK(wallet->cs_wallet);

    const auto active_spk_mans = wallet->GetActiveScriptPubKeyMans();

    struct WalletDescInfo {
        std::string descriptor;
        uint64_t creation_time;
        bool active;
        std::optional<bool> internal;
        std::optional<std::pair<int64_t,int64_t>> range;
        int64_t next_index;
    };

    std::vector<WalletDescInfo> wallet_descriptors;
    for (const auto& spk_man : wallet->GetAllScriptPubKeyMans()) {
        const auto desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man);
        if (!desc_spk_man) {
            throw JSONRPCError(RPC_WALLET_ERROR, "Unexpected ScriptPubKey manager type.");
        }
        LOCK(desc_spk_man->cs_desc_man);
        const auto& wallet_descriptor = desc_spk_man->GetWalletDescriptor();
        std::string descriptor;
        if (!desc_spk_man->GetDescriptorString(descriptor, priv)) {
            throw JSONRPCError(RPC_WALLET_ERROR, "Can't get descriptor string.");
        }
        const bool is_range = wallet_descriptor.descriptor->IsRange();
        wallet_descriptors.push_back({
            descriptor,
            wallet_descriptor.creation_time,
            active_spk_mans.count(desc_spk_man) != 0,
            wallet->IsInternalScriptPubKeyMan(desc_spk_man),
            is_range ? std::optional(std::make_pair(wallet_descriptor.range_start, wallet_descriptor.range_end)) : std::nullopt,
            wallet_descriptor.next_index
        });
    }

    std::sort(wallet_descriptors.begin(), wallet_descriptors.end(), [](const auto& a, const auto& b) {
        return a.descriptor < b.descriptor;
    });

    UniValue descriptors(UniValue::VARR);
    for (const WalletDescInfo& info : wallet_descriptors) {
        UniValue spk(UniValue::VOBJ);
        spk.pushKV("desc", info.descriptor);
        spk.pushKV("timestamp", info.creation_time);
        spk.pushKV("active", info.active);
        if (info.internal.has_value()) {
            spk.pushKV("internal", info.internal.value());
        }
        if (info.range.has_value()) {
            UniValue range(UniValue::VARR);
            range.push_back(info.range->first);
            range.push_back(info.range->second - 1);
            spk.pushKV("range", std::move(range));
            spk.pushKV("next", info.next_index);
            spk.pushKV("next_index", info.next_index);
        }
        descriptors.push_back(std::move(spk));
    }

    UniValue response(UniValue::VOBJ);
    response.pushKV("wallet_name", wallet->GetName());
    response.pushKV("descriptors", std::move(descriptors));

    return response;
},
    };
}